

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xxhash.h
# Opt level: O3

XXH_errorcode XXH3_64bits_reset_withSeed(XXH3_state_t *statePtr,XXH64_hash_t seed)

{
  long lVar1;
  xxh_u8 *pxVar2;
  long lVar3;
  
  if (statePtr == (XXH3_state_t *)0x0) {
    return XXH_ERROR;
  }
  if (seed == 0) {
    statePtr->bufferedSize = 0;
    statePtr->useSeed = 0;
    statePtr->nbStripesSoFar = 0;
    statePtr->totalLen = 0;
    statePtr->acc[0] = 0xc2b2ae3d;
    statePtr->acc[1] = 0x9e3779b185ebca87;
    statePtr->acc[2] = 0xc2b2ae3d27d4eb4f;
    statePtr->acc[3] = 0x165667b19e3779f9;
    statePtr->acc[4] = 0x85ebca77c2b2ae63;
    statePtr->acc[5] = 0x85ebca77;
    statePtr->acc[6] = 0x27d4eb2f165667c5;
    statePtr->acc[7] = 0x9e3779b1;
    statePtr->seed = 0;
    pxVar2 = XXH3_kSecret;
  }
  else {
    if ((statePtr->seed != seed) || (statePtr->extSecret != (uchar *)0x0)) {
      lVar3 = 0;
      do {
        lVar1 = *(long *)(XXH3_kSecret + lVar3 + 8);
        *(XXH64_hash_t *)(statePtr->customSecret + lVar3) = *(long *)(XXH3_kSecret + lVar3) + seed;
        *(XXH64_hash_t *)(statePtr->customSecret + lVar3 + 8) = lVar1 - seed;
        lVar3 = lVar3 + 0x10;
      } while (lVar3 != 0xc0);
    }
    statePtr->bufferedSize = 0;
    statePtr->useSeed = 0;
    statePtr->nbStripesSoFar = 0;
    statePtr->totalLen = 0;
    statePtr->acc[0] = 0xc2b2ae3d;
    statePtr->acc[1] = 0x9e3779b185ebca87;
    statePtr->acc[2] = 0xc2b2ae3d27d4eb4f;
    statePtr->acc[3] = 0x165667b19e3779f9;
    statePtr->acc[4] = 0x85ebca77c2b2ae63;
    statePtr->acc[5] = 0x85ebca77;
    statePtr->acc[6] = 0x27d4eb2f165667c5;
    statePtr->acc[7] = 0x9e3779b1;
    statePtr->seed = seed;
    statePtr->useSeed = 1;
    pxVar2 = (xxh_u8 *)0x0;
  }
  statePtr->extSecret = pxVar2;
  statePtr->secretLimit = 0x80;
  statePtr->nbStripesPerBlock = 0x10;
  return XXH_OK;
}

Assistant:

XXH_PUBLIC_API XXH_errorcode
XXH3_64bits_reset_withSeed(XXH_NOESCAPE XXH3_state_t* statePtr, XXH64_hash_t seed)
{
    if (statePtr == NULL) return XXH_ERROR;
    if (seed==0) return XXH3_64bits_reset(statePtr);
    if ((seed != statePtr->seed) || (statePtr->extSecret != NULL))
        XXH3_initCustomSecret(statePtr->customSecret, seed);
    XXH3_reset_internal(statePtr, seed, NULL, XXH_SECRET_DEFAULT_SIZE);
    return XXH_OK;
}